

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

TestProperty * __thiscall testing::TestResult::GetTestProperty(TestResult *this,int i)

{
  const_reference pvVar1;
  
  if ((-1 < i) &&
     (i < (int)((ulong)((long)(this->test_properties_).
                              super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->test_properties_).
                             super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6))) {
    pvVar1 = std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::at
                       (&this->test_properties_,(ulong)(uint)i);
    return pvVar1;
  }
  abort();
}

Assistant:

const TestProperty& TestResult::GetTestProperty(int i) const {
  if (i < 0 || i >= test_property_count())
    internal::posix::Abort();
  return test_properties_.at(i);
}